

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O2

CTransactionRef __thiscall TxOrphanage::GetTxToReconsider(TxOrphanage *this,NodeId peer)

{
  const_iterator __position;
  iterator iVar1;
  iterator iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_FS_OFFSET;
  CTransactionRef CVar4;
  Wtxid wtxid;
  key_type_conflict local_60;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = std::
          _Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
          ::find((_Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
                  *)(peer + 0x30),&local_60);
  _Var3._M_pi = extraout_RDX;
  if (iVar1._M_node == (_Base_ptr)(peer + 0x38)) {
LAB_003515ff:
    *(undefined8 *)&(this->m_orphans)._M_t._M_impl = 0;
    *(undefined8 *)&(this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  else {
    do {
      if (iVar1._M_node[2]._M_left == (_Base_ptr)0x0) goto LAB_003515ff;
      __position._M_node = iVar1._M_node[2];
      local_58._0_8_ = *(undefined8 *)(__position._M_node + 1);
      local_58._8_8_ = __position._M_node[1]._M_parent;
      local_48 = __position._M_node[1]._M_left;
      p_Stack_40 = __position._M_node[1]._M_right;
      std::
      _Rb_tree<transaction_identifier<true>,transaction_identifier<true>,std::_Identity<transaction_identifier<true>>,std::less<transaction_identifier<true>>,std::allocator<transaction_identifier<true>>>
      ::erase_abi_cxx11_((_Rb_tree<transaction_identifier<true>,transaction_identifier<true>,std::_Identity<transaction_identifier<true>>,std::less<transaction_identifier<true>>,std::allocator<transaction_identifier<true>>>
                          *)&iVar1._M_node[1]._M_parent,__position);
      iVar2 = std::
              _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
              ::find((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                      *)peer,(key_type *)local_58);
      _Var3._M_pi = extraout_RDX_00;
    } while (iVar2._M_node == (_Base_ptr)(peer + 8));
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(iVar2._M_node + 2));
    _Var3._M_pi = extraout_RDX_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

CTransactionRef TxOrphanage::GetTxToReconsider(NodeId peer)
{
    auto work_set_it = m_peer_work_set.find(peer);
    if (work_set_it != m_peer_work_set.end()) {
        auto& work_set = work_set_it->second;
        while (!work_set.empty()) {
            Wtxid wtxid = *work_set.begin();
            work_set.erase(work_set.begin());

            const auto orphan_it = m_orphans.find(wtxid);
            if (orphan_it != m_orphans.end()) {
                return orphan_it->second.tx;
            }
        }
    }
    return nullptr;
}